

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation_node.cpp
# Opt level: O1

void __thiscall
duckdb::SetOperationNode::SetOperationNode
          (SetOperationNode *this,SetOperationType setop_type,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *left,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *right,
          vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
          *children,bool setop_all)

{
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *puVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  pointer __p;
  reference pvVar3;
  reference args_2;
  pointer puVar4;
  SerializationException *pSVar5;
  pointer puVar6;
  size_type sVar7;
  size_type __n;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var8;
  templated_unique_single_t setop_node;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
  empty_children;
  SetOperationType local_92;
  bool local_91;
  SetOperationNode *local_90;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_88;
  QueryNode *local_80;
  string local_78;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *local_38;
  
  local_92 = setop_type;
  local_91 = setop_all;
  QueryNode::QueryNode(&this->super_QueryNode,SET_OPERATION_NODE);
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)&PTR__SetOperationNode_02492a60;
  this->setop_type = local_92;
  this->setop_all = local_91;
  puVar1 = &this->left;
  (this->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  (this->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  _Var8._M_head_impl =
       (left->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  local_90 = this;
  if ((_Var8._M_head_impl == (QueryNode *)0x0) ||
     ((right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
    if ((long)(children->
              super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(children->
              super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::operator[](children,0);
      _Var8._M_head_impl =
           (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      _Var2._M_head_impl =
           (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
      if (_Var2._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      }
      pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::operator[](children,1);
      _Var8._M_head_impl =
           (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      _Var2._M_head_impl =
           (local_90->right).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
      ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
      if (_Var2._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      }
    }
    if ((ulong)((long)(children->
                      super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(children->
                     super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9) {
      pSVar5 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Set Operation requires at least 2 children","");
      SerializationException::SerializationException(pSVar5,&local_78);
      __cxa_throw(pSVar5,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_38 = puVar1;
    if (local_92 != UNION) {
      pSVar5 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "Multiple children in set-operations are only supported for UNION","");
      SerializationException::SerializationException(pSVar5,&local_78);
      __cxa_throw(pSVar5,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0x10 < (ulong)((long)(children->
                             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(children->
                            super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      do {
        local_58 = (pointer)0x0;
        puStack_50 = (pointer)0x0;
        local_48 = (pointer)0x0;
        puVar4 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar6 - (long)puVar4 != 0) {
          sVar7 = (long)puVar6 - (long)puVar4 >> 3;
          __n = 0;
          do {
            if (__n + 1 == sVar7) {
              pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n);
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                          *)&local_58,pvVar3);
            }
            else {
              local_78._M_dataplus._M_p = (pointer)0x0;
              local_78._M_string_length = 0;
              local_78.field_2._M_allocated_capacity = 0;
              pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n);
              args_2 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n + 1);
              make_uniq<duckdb::SetOperationNode,duckdb::SetOperationType&,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,true>,bool&>
                        ((duckdb *)&local_80,&local_92,pvVar3,args_2,
                         (vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                          *)&local_78,&local_91);
              local_88._M_head_impl = local_80;
              local_80 = (QueryNode *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                          *)&local_58,
                         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                          *)&local_88);
              if (local_88._M_head_impl != (QueryNode *)0x0) {
                (*(local_88._M_head_impl)->_vptr_QueryNode[1])();
              }
              if (local_80 != (QueryNode *)0x0) {
                (*local_80->_vptr_QueryNode[1])();
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                         *)&local_78);
            }
            __n = __n + 2;
            puVar4 = (children->
                     super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar6 = (children->
                     super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar7 = (long)puVar6 - (long)puVar4 >> 3;
          } while (__n < sVar7);
        }
        local_78.field_2._M_allocated_capacity =
             (size_type)
             (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (children->
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_58;
        (children->
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puStack_50;
        (children->
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
        local_58 = (pointer)0x0;
        puStack_50 = (pointer)0x0;
        local_48 = (pointer)0x0;
        local_78._M_dataplus._M_p = (pointer)puVar4;
        local_78._M_string_length = (size_type)puVar6;
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   *)&local_78);
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   *)&local_58);
      } while (0x10 < (ulong)((long)(children->
                                    super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(children->
                                   super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::operator[](children,0);
    _Var8._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var2._M_head_impl =
         (local_38->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_38->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::operator[](children,1);
    _Var2._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var8._M_head_impl =
         (local_90->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  }
  else {
    (left->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var2._M_head_impl =
         (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    _Var2._M_head_impl =
         (right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var8._M_head_impl =
         (local_90->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  }
  if (_Var8._M_head_impl != (QueryNode *)0x0) {
    (*(_Var8._M_head_impl)->_vptr_QueryNode[1])();
  }
  return;
}

Assistant:

SetOperationNode::SetOperationNode(SetOperationType setop_type, unique_ptr<QueryNode> left, unique_ptr<QueryNode> right,
                                   vector<unique_ptr<QueryNode>> children, bool setop_all)
    : QueryNode(QueryNodeType::SET_OPERATION_NODE), setop_type(setop_type), setop_all(setop_all) {
	if (left && right) {
		// simple case - left/right are supplied
		this->left = std::move(left);
		this->right = std::move(right);
		return;
	}
	if (children.size() == 2) {
		this->left = std::move(children[0]);
		this->right = std::move(children[1]);
	}
	// we have multiple children - we need to construct a tree of set operation nodes
	if (children.size() <= 1) {
		throw SerializationException("Set Operation requires at least 2 children");
	}
	if (setop_type != SetOperationType::UNION) {
		throw SerializationException("Multiple children in set-operations are only supported for UNION");
	}
	// construct a balanced tree from the union
	while (children.size() > 2) {
		vector<unique_ptr<QueryNode>> new_children;
		for (idx_t i = 0; i < children.size(); i += 2) {
			if (i + 1 == children.size()) {
				new_children.push_back(std::move(children[i]));
			} else {
				vector<unique_ptr<QueryNode>> empty_children;
				auto setop_node =
				    make_uniq<SetOperationNode>(setop_type, std::move(children[i]), std::move(children[i + 1]),
				                                std::move(empty_children), setop_all);
				new_children.push_back(std::move(setop_node));
			}
		}
		children = std::move(new_children);
	}
	// two children left - fill in the left/right of this node
	this->left = std::move(children[0]);
	this->right = std::move(children[1]);
}